

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

vec2 dja::normalize(vec2 *a)

{
  vec2 vVar1;
  float fVar2;
  
  fVar2 = a->x * a->x + a->y * a->y;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  vVar1.y = (1.0 / fVar2) * a->y;
  vVar1.x = a->x * (1.0 / fVar2);
  return vVar1;
}

Assistant:

V2 normalize(const V2& a) {return a / norm(a);}